

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sskdf.c
# Opt level: O0

int kmac_init(void *vmacctx,uchar *key,size_t keylen,OSSL_PARAM *params)

{
  EVP_MD_CTX *ctx_00;
  int iVar1;
  EVP_MD *type;
  void *d;
  long in_RSI;
  long in_RDI;
  OSSL_PARAM cparams [2];
  int t;
  int res;
  size_t block_len;
  size_t out_len;
  uchar *out;
  EVP_MD_CTX *ctx;
  kmac_data_st *kctx;
  EVP_MD *in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  OSSL_PARAM *in_stack_ffffffffffffff50;
  EVP_MD_CTX *ctx_01;
  kmac_data_st *in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff60;
  uchar *in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff70;
  uchar *in_stack_ffffffffffffff78;
  size_t *in_stack_ffffffffffffff80;
  uchar *in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffffa0;
  size_t local_48;
  uint uVar2;
  
  ctx_00 = *(EVP_MD_CTX **)(in_RDI + 8);
  iVar1 = ossl_prov_is_running();
  if ((iVar1 == 0) ||
     (iVar1 = kmac_set_ctx_params(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50), iVar1 == 0))
  {
    uVar2 = 0;
  }
  else {
    if (in_RSI == 0) {
      if (*(long *)(in_RDI + 0x30) == 0) {
        ERR_new();
        ERR_set_debug((char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                      in_stack_ffffffffffffff40);
        ERR_set_error(0x39,0x72,(char *)0x0);
        return 0;
      }
    }
    else {
      iVar1 = kmac_setkey(in_stack_ffffffffffffff58,(uchar *)in_stack_ffffffffffffff50,
                          CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      if (iVar1 == 0) {
        return 0;
      }
    }
    ctx_01 = *(EVP_MD_CTX **)(in_RDI + 8);
    type = ossl_prov_digest_md((PROV_DIGEST *)(in_RDI + 0x10));
    iVar1 = EVP_DigestInit_ex(ctx_01,(EVP_MD *)type,(ENGINE *)0x0);
    if (iVar1 == 0) {
      uVar2 = 0;
    }
    else {
      ossl_prov_digest_md((PROV_DIGEST *)(in_RDI + 0x10));
      iVar1 = EVP_MD_get_block_size(in_stack_ffffffffffffff38);
      if (iVar1 < 0) {
        ERR_new();
        ERR_set_debug((char *)ctx_01,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40);
        ERR_set_error(0x39,0xa6,(char *)0x0);
        uVar2 = 0;
      }
      else {
        if (*(long *)(in_RDI + 0x38) == 0) {
          memcpy(&stack0xffffffffffffff58,&PTR_anon_var_dwarf_eaa7d_005c4690,0x50);
          kmac_set_ctx_params(in_stack_ffffffffffffff58,(OSSL_PARAM *)ctx_01);
        }
        iVar1 = bytepad(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                        in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                        in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                        in_stack_ffffffffffffffa0);
        if (iVar1 == 0) {
          ERR_new();
          ERR_set_debug((char *)ctx_01,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40);
          ERR_set_error(0x39,0xc0103,(char *)0x0);
          uVar2 = 0;
        }
        else {
          d = CRYPTO_malloc((int)local_48,"providers/implementations/macs/kmac_prov.c",0x138);
          if (d == (void *)0x0) {
            ERR_new();
            ERR_set_debug((char *)ctx_01,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40);
            ERR_set_error(0x39,0xc0100,(char *)0x0);
            uVar2 = 0;
          }
          else {
            iVar1 = bytepad(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                            in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                            in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                            in_stack_ffffffffffffffa0);
            uVar2 = 0;
            if (iVar1 != 0) {
              iVar1 = EVP_DigestUpdate(ctx_00,d,local_48);
              uVar2 = 0;
              if (iVar1 != 0) {
                iVar1 = EVP_DigestUpdate(ctx_00,(void *)(in_RDI + 0x44),*(size_t *)(in_RDI + 0x30));
                uVar2 = (uint)(iVar1 != 0) << 0x18;
              }
            }
            uVar2 = uVar2 >> 0x18;
            CRYPTO_free(d);
          }
        }
      }
    }
  }
  return uVar2;
}

Assistant:

static int kmac_init(EVP_MAC_CTX *ctx, const unsigned char *custom,
                     size_t custom_len, size_t kmac_out_len,
                     size_t derived_key_len, unsigned char **out)
{
    OSSL_PARAM params[2];

    /* Only KMAC has custom data - so return if not KMAC */
    if (custom == NULL)
        return 1;

    params[0] = OSSL_PARAM_construct_octet_string(OSSL_MAC_PARAM_CUSTOM,
                                                  (void *)custom, custom_len);
    params[1] = OSSL_PARAM_construct_end();

    if (!EVP_MAC_CTX_set_params(ctx, params))
        return 0;

    /* By default only do one iteration if kmac_out_len is not specified */
    if (kmac_out_len == 0)
        kmac_out_len = derived_key_len;
    /* otherwise check the size is valid */
    else if (!(kmac_out_len == derived_key_len
            || kmac_out_len == 20
            || kmac_out_len == 28
            || kmac_out_len == 32
            || kmac_out_len == 48
            || kmac_out_len == 64))
        return 0;

    params[0] = OSSL_PARAM_construct_size_t(OSSL_MAC_PARAM_SIZE,
                                            &kmac_out_len);

    if (EVP_MAC_CTX_set_params(ctx, params) <= 0)
        return 0;

    /*
     * For kmac the output buffer can be larger than EVP_MAX_MD_SIZE: so
     * alloc a buffer for this case.
     */
    if (kmac_out_len > EVP_MAX_MD_SIZE) {
        *out = OPENSSL_zalloc(kmac_out_len);
        if (*out == NULL)
            return 0;
    }
    return 1;
}